

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSliceStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [8];
  string err_4;
  undefined1 local_198 [8];
  string err_3;
  undefined1 local_158 [8];
  string err_2;
  undefined1 local_118 [8];
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string err;
  SliceStaticLayerParams *params;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    validateOutputCount((Result *)&params,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    Result::operator=((Result *)local_48,(Result *)&params);
    Result::~Result((Result *)&params);
  }
  err.field_2._8_8_ =
       (size_type)Specification::NeuralNetworkLayer::slicestatic(r.m_message.field_2._8_8_);
  iVar2 = Specification::SliceStaticLayerParams::beginids_size
                    ((SliceStaticLayerParams *)err.field_2._8_8_);
  if (iVar2 == 0) {
    psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::operator+(&local_f0,"Begin IDs are required parameters for \'",psVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   &local_f0,"\' layer.");
    std::__cxx11::string::~string((string *)&local_f0);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d0);
    err_1.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_d0);
  }
  else {
    iVar2 = Specification::SliceStaticLayerParams::endids_size
                      ((SliceStaticLayerParams *)err.field_2._8_8_);
    if (iVar2 == 0) {
      psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&err_2.field_2 + 8),"End IDs are required parameters for \'",psVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&err_2.field_2 + 8),"\' layer.");
      std::__cxx11::string::~string((string *)(err_2.field_2._M_local_buf + 8));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_118);
      err_1.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_118);
    }
    else {
      iVar2 = Specification::SliceStaticLayerParams::strides_size
                        ((SliceStaticLayerParams *)err.field_2._8_8_);
      if (iVar2 == 0) {
        psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&err_3.field_2 + 8),"Strides are required parameters for \'",psVar3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&err_3.field_2 + 8),"\' layer.");
        std::__cxx11::string::~string((string *)(err_3.field_2._M_local_buf + 8));
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_158);
        err_1.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_158);
      }
      else {
        iVar2 = Specification::SliceStaticLayerParams::beginmasks_size
                          ((SliceStaticLayerParams *)err.field_2._8_8_);
        if (iVar2 == 0) {
          psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&err_4.field_2 + 8),"Begin masks are required parameters for \'",
                         psVar3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&err_4.field_2 + 8),"\' layer.");
          std::__cxx11::string::~string((string *)(err_4.field_2._M_local_buf + 8));
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_198);
          err_1.field_2._12_4_ = 1;
          std::__cxx11::string::~string((string *)local_198);
        }
        else {
          iVar2 = Specification::SliceStaticLayerParams::endmasks_size
                            ((SliceStaticLayerParams *)err.field_2._8_8_);
          if (iVar2 == 0) {
            psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
            std::operator+(&local_1f8,"End masks are required parameters for \'",psVar3);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1d8,&local_1f8,"\' layer.");
            std::__cxx11::string::~string((string *)&local_1f8);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1d8);
            err_1.field_2._12_4_ = 1;
            std::__cxx11::string::~string((string *)local_1d8);
          }
          else {
            Result::Result(__return_storage_ptr__,(Result *)local_48);
            err_1.field_2._12_4_ = 1;
          }
        }
      }
    }
  }
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSliceStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.slicestatic();
    // check for required parameters
    if (params.beginids_size() == 0) {
        const std::string err = "Begin IDs are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.endids_size() == 0) {
        const std::string err = "End IDs are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.strides_size() == 0) {
        const std::string err = "Strides are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.beginmasks_size() == 0) {
        const std::string err = "Begin masks are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.endmasks_size() == 0) {
        const std::string err = "End masks are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}